

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeMergeEngineStep(MergeEngine *pMerger,int *pbEof)

{
  SortSubtask *pSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  PmaReader *pPVar5;
  int *piVar6;
  uint uVar7;
  PmaReader *pPVar8;
  PmaReader *pPVar9;
  long in_FS_OFFSET;
  int bCached;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = pMerger->pTask;
  uVar7 = pMerger->aTree[1];
  uVar3 = vdbePmaReaderNext(pMerger->aReadr + (int)uVar7);
  if (uVar3 == 0) {
    local_3c = 0;
    uVar3 = pMerger->nTree + uVar7;
    pPVar5 = pMerger->aReadr;
    if ((int)uVar3 < 2) {
      piVar6 = pMerger->aTree;
    }
    else {
      pPVar9 = pPVar5 + ((long)(int)uVar7 | 1);
      pPVar8 = (PmaReader *)((long)&pPVar5->iReadOff + (ulong)((uVar7 & 0xfffe) * 0x50));
      do {
        uVar7 = uVar3 >> 1;
        if (pPVar8->pFd == (sqlite3_file *)0x0) {
LAB_0015ab04:
          piVar6 = pMerger->aTree;
          pPVar5 = pMerger->aReadr;
          piVar6[uVar7] = (int)((ulong)((long)pPVar9 - (long)pPVar5) >> 4) * -0x33333333;
          pPVar8 = pPVar5 + piVar6[uVar7 ^ 1];
        }
        else {
          if (pPVar9->pFd != (sqlite3_file *)0x0) {
            iVar4 = (*pSVar1->xCompare)(pSVar1,&local_3c,pPVar8->aKey,pPVar8->nKey,pPVar9->aKey,
                                        pPVar9->nKey);
            if ((-1 < iVar4) && ((iVar4 != 0 || (pPVar9 <= pPVar8)))) {
              if (pPVar8->pFd != (sqlite3_file *)0x0) {
                local_3c = 0;
              }
              goto LAB_0015ab04;
            }
          }
          piVar6 = pMerger->aTree;
          pPVar5 = pMerger->aReadr;
          piVar6[uVar7] = (int)((ulong)((long)pPVar8 - (long)pPVar5) >> 4) * -0x33333333;
          pPVar9 = pPVar5 + piVar6[uVar7 ^ 1];
          local_3c = 0;
        }
        bVar2 = 3 < uVar3;
        uVar3 = uVar7;
      } while (bVar2);
    }
    *pbEof = (uint)(pPVar5[piVar6[1]].pFd == (sqlite3_file *)0x0);
    uVar3 = (uint)pSVar1->pUnpacked->errCode;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

static int vdbeMergeEngineStep(
  MergeEngine *pMerger,      /* The merge engine to advance to the next row */
  int *pbEof                 /* Set TRUE at EOF.  Set false for more content */
){
  int rc;
  int iPrev = pMerger->aTree[1];/* Index of PmaReader to advance */
  SortSubtask *pTask = pMerger->pTask;

  /* Advance the current PmaReader */
  rc = vdbePmaReaderNext(&pMerger->aReadr[iPrev]);

  /* Update contents of aTree[] */
  if( rc==SQLITE_OK ){
    int i;                      /* Index of aTree[] to recalculate */
    PmaReader *pReadr1;         /* First PmaReader to compare */
    PmaReader *pReadr2;         /* Second PmaReader to compare */
    int bCached = 0;

    /* Find the first two PmaReaders to compare. The one that was just
    ** advanced (iPrev) and the one next to it in the array.  */
    pReadr1 = &pMerger->aReadr[(iPrev & 0xFFFE)];
    pReadr2 = &pMerger->aReadr[(iPrev | 0x0001)];

    for(i=(pMerger->nTree+iPrev)/2; i>0; i=i/2){
      /* Compare pReadr1 and pReadr2. Store the result in variable iRes. */
      int iRes;
      if( pReadr1->pFd==0 ){
        iRes = +1;
      }else if( pReadr2->pFd==0 ){
        iRes = -1;
      }else{
        iRes = pTask->xCompare(pTask, &bCached,
            pReadr1->aKey, pReadr1->nKey, pReadr2->aKey, pReadr2->nKey
        );
      }

      /* If pReadr1 contained the smaller value, set aTree[i] to its index.
      ** Then set pReadr2 to the next PmaReader to compare to pReadr1. In this
      ** case there is no cache of pReadr2 in pTask->pUnpacked, so set
      ** pKey2 to point to the record belonging to pReadr2.
      **
      ** Alternatively, if pReadr2 contains the smaller of the two values,
      ** set aTree[i] to its index and update pReadr1. If vdbeSorterCompare()
      ** was actually called above, then pTask->pUnpacked now contains
      ** a value equivalent to pReadr2. So set pKey2 to NULL to prevent
      ** vdbeSorterCompare() from decoding pReadr2 again.
      **
      ** If the two values were equal, then the value from the oldest
      ** PMA should be considered smaller. The VdbeSorter.aReadr[] array
      ** is sorted from oldest to newest, so pReadr1 contains older values
      ** than pReadr2 iff (pReadr1<pReadr2).  */
      if( iRes<0 || (iRes==0 && pReadr1<pReadr2) ){
        pMerger->aTree[i] = (int)(pReadr1 - pMerger->aReadr);
        pReadr2 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
        bCached = 0;
      }else{
        if( pReadr1->pFd ) bCached = 0;
        pMerger->aTree[i] = (int)(pReadr2 - pMerger->aReadr);
        pReadr1 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
      }
    }
    *pbEof = (pMerger->aReadr[pMerger->aTree[1]].pFd==0);
  }

  return (rc==SQLITE_OK ? pTask->pUnpacked->errCode : rc);
}